

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

ForStreamable<MoveOnly,_std::string> *
lest::make_string<MoveOnly>
          (ForStreamable<MoveOnly,_std::string> *__return_storage_ptr__,MoveOnly *item)

{
  ostringstream os;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"MoveOnly:",9);
  std::ostream::operator<<((ostream *)local_190,item->x);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( T const & item ) -> ForStreamable<T, std::string>
{
    std::ostringstream os; os << item; return os.str();
}